

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

file_format_t __thiscall
cfgfile::details::determine_format_t<cfgfile::qstring_trait_t>::format
          (determine_format_t<cfgfile::qstring_trait_t> *this)

{
  bool bVar1;
  int iVar2;
  QChar *in_RDI;
  char_t ch;
  int in_stack_ffffffffffffffdc;
  QChar local_12 [7];
  file_format_t local_4;
  
  if ((format()::xml == '\0') && (iVar2 = __cxa_guard_acquire(&format()::xml), iVar2 != 0)) {
    format::xml = qstring_trait_t::from_ascii('\0');
    __cxa_guard_release(&format()::xml);
  }
  QChar::QChar(in_RDI,in_stack_ffffffffffffffdc);
  do {
    bVar1 = qstring_trait_t::is_at_end((istream_t *)0x1134cc);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return cfgfile_format;
    }
    QTextStream::operator>>(*(QTextStream **)in_RDI,(QChar *)local_12);
    bVar1 = qstring_trait_t::is_space((char_t)0x0);
  } while (bVar1);
  bVar1 = ::operator==(local_12[0],(QChar)format::xml.ucs);
  local_4 = (file_format_t)bVar1;
  return local_4;
}

Assistant:

file_format_t format()
	{
		static const typename Trait::char_t xml = Trait::from_ascii( '<' );

		typename Trait::char_t ch( 0x00 );

		while( !Trait::is_at_end( m_stream ) )
		{
			m_stream >> ch;

			if( Trait::is_space( ch ) )
				continue;

			if( ch == xml )
				return file_format_t::xml_format;
			else
				return file_format_t::cfgfile_format;
		}

		return file_format_t::cfgfile_format;
	}